

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::printMatrix4x4<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  int64_t iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 uVar2;
  SquareMatrix<std::complex<double>_> *pSVar3;
  complex<double> val;
  complex<double> val_00;
  complex<double> val_01;
  complex<double> val_02;
  complex<double> val_03;
  complex<double> val_04;
  complex<double> val_05;
  complex<double> val_06;
  complex<double> val_07;
  complex<double> val_08;
  complex<double> val_09;
  complex<double> val_10;
  complex<double> val_11;
  complex<double> val_12;
  complex<double> val_13;
  complex<double> val_14;
  SquareMatrix<std::complex<double>_> *mat_local;
  
  iVar1 = dense::SquareMatrix<std::complex<double>_>::rows(mat);
  if (iVar1 != 4) {
    __assert_fail("mat.rows() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                  ,0x6a,
                  "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
                 );
  }
  iVar1 = dense::SquareMatrix<std::complex<double>_>::cols(mat);
  if (iVar1 == 4) {
    uVar2 = 0;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,0,0);
    val._M_value._8_8_ = extraout_RDX;
    val._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val);
    uVar2 = 0;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,0,1);
    val_00._M_value._8_8_ = extraout_RDX_00;
    val_00._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_00);
    uVar2 = 0;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,0,2);
    val_01._M_value._8_8_ = extraout_RDX_01;
    val_01._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_01);
    uVar2 = 0;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,0,3);
    val_02._M_value._8_8_ = extraout_RDX_02;
    val_02._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_02);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    uVar2 = 1;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,1,0);
    val_03._M_value._8_8_ = extraout_RDX_03;
    val_03._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_03);
    uVar2 = 1;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,1,1);
    val_04._M_value._8_8_ = extraout_RDX_04;
    val_04._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_04);
    uVar2 = 1;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,1,2);
    val_05._M_value._8_8_ = extraout_RDX_05;
    val_05._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_05);
    uVar2 = 1;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,1,3);
    val_06._M_value._8_8_ = extraout_RDX_06;
    val_06._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_06);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    uVar2 = 2;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,2,0);
    val_07._M_value._8_8_ = extraout_RDX_07;
    val_07._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_07);
    uVar2 = 2;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,2,1);
    val_08._M_value._8_8_ = extraout_RDX_08;
    val_08._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_08);
    uVar2 = 2;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,2,2);
    val_09._M_value._8_8_ = extraout_RDX_09;
    val_09._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_09);
    uVar2 = 2;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,2,3);
    val_10._M_value._8_8_ = extraout_RDX_10;
    val_10._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_10);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    uVar2 = 3;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,3,0);
    val_11._M_value._8_8_ = extraout_RDX_11;
    val_11._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_11);
    uVar2 = 3;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,3,1);
    val_12._M_value._8_8_ = extraout_RDX_12;
    val_12._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_12);
    uVar2 = 3;
    pSVar3 = mat;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,3,2);
    val_13._M_value._8_8_ = extraout_RDX_13;
    val_13._M_value._0_8_ = uVar2;
    print<double>((qclab *)pSVar3,val_13);
    uVar2 = 3;
    dense::SquareMatrix<std::complex<double>_>::operator()(mat,3,3);
    val_14._M_value._8_8_ = extraout_RDX_14;
    val_14._M_value._0_8_ = uVar2;
    print<double>((qclab *)mat,val_14);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("mat.cols() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x6b,
                "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void printMatrix4x4( const T& mat ) {
    assert( mat.rows() == 4 ) ;
    assert( mat.cols() == 4 ) ;
    print( mat(0,0) ); print( mat(0,1) ); print( mat(0,2) ); print( mat(0,3) );
    std::cout << std::endl ;
    print( mat(1,0) ); print( mat(1,1) ); print( mat(1,2) ); print( mat(1,3) );
    std::cout << std::endl ;
    print( mat(2,0) ); print( mat(2,1) ); print( mat(2,2) ); print( mat(2,3) );
    std::cout << std::endl ;
    print( mat(3,0) ); print( mat(3,1) ); print( mat(3,2) ); print( mat(3,3) );
    std::cout << std::endl ;
  }